

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

ast * allocast(int nodetype,char *name,YYLTYPE *pos,int num,...)

{
  ast *paVar1;
  ast *paVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char in_AL;
  ast *paVar6;
  YYLTYPE *pYVar7;
  ast **ppaVar8;
  uint uVar9;
  void **ppvVar10;
  ulong uVar11;
  void **ppvVar12;
  ast *in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  uint local_f8;
  void *local_d8 [4];
  ast *local_b8;
  undefined8 local_b0;
  undefined4 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Da;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  ppvVar10 = &ap[0].overflow_arg_area;
  local_b8 = in_R8;
  local_b0 = in_R9;
  paVar6 = (ast *)calloc(1,0x50);
  if (pos == (YYLTYPE *)0x0) {
    paVar6->pos = (YYLTYPE *)0x0;
  }
  else {
    pYVar7 = (YYLTYPE *)malloc(0x10);
    paVar6->pos = pYVar7;
    if (pYVar7 == (YYLTYPE *)0x0) {
      err(1,"malloc");
    }
    iVar3 = pos->first_column;
    iVar4 = pos->last_line;
    iVar5 = pos->last_column;
    pYVar7->first_line = pos->first_line;
    pYVar7->first_column = iVar3;
    pYVar7->last_line = iVar4;
    pYVar7->last_column = iVar5;
  }
  paVar6->type = nodetype;
  if (num == 0) {
    paVar6->left = (ast *)0x0;
  }
  else {
    paVar6->left = local_b8;
    if (1 < num) {
      ppaVar8 = &paVar6->left;
      local_f8 = 0x28;
      uVar9 = num + 1;
      do {
        paVar1 = *ppaVar8;
        paVar1->parent = paVar6;
        if (local_f8 < 0x29) {
          uVar11 = (ulong)local_f8;
          local_f8 = local_f8 + 8;
          ppvVar12 = (void **)((long)local_d8 + uVar11);
        }
        else {
          ppvVar12 = ppvVar10;
          ppvVar10 = ppvVar10 + 1;
        }
        paVar2 = (ast *)*ppvVar12;
        paVar1->right = paVar2;
        if (paVar2 != (ast *)0x0) {
          paVar2->pre = paVar1;
        }
        ppaVar8 = &paVar1->right;
        uVar9 = uVar9 - 1;
      } while (2 < uVar9);
    }
  }
  paVar6->name = name;
  paVar6->filename = cur_file;
  return paVar6;
}

Assistant:

struct ast *allocast(int nodetype, const char *name, struct YYLTYPE *pos, int num, ...) {
    va_list ap;
    va_start(ap, num);
    struct ast *node = malloc(sizeof(struct ast));
    memset(node, 0, sizeof(struct ast));
    if (!node)
        err(EXIT_FAILURE, "malloc");
    if (pos) {
        node->pos = malloc(sizeof(struct YYLTYPE));
        if (!node->pos)
            err(EXIT_FAILURE, "malloc");
        *(node->pos) = *pos;
    } else
        node->pos = NULL;
    node->type = nodetype;
    if (num != 0)
        node->left = va_arg(ap, struct ast*);
    else
        node->left = NULL;
    struct ast *p = node->left;
    while (--num > 0) {
        p->parent = node;
        p->right = va_arg(ap, struct ast*);
        if (p->right)
            p->right->pre = p;
        p = p->right;
    }
    va_end(ap);
    node->name = name;
    node->filename = cur_file;
    return node;
}